

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O1

void __thiscall
acto::actor::handler<msg_finish,Wall,msg_finish_const&>(actor *this,offset_in_Wall_to_subr func)

{
  undefined8 in_RDX;
  pointer *__ptr;
  mem_handler_t<msg_finish,_Wall,_const_msg_finish_&> *local_58;
  _Head_base<0UL,_acto::actor::handler_t_*,_false> local_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  type_index local_28;
  
  local_28._M_target = (type_info *)&msg_finish::typeinfo;
  local_58 = (mem_handler_t<msg_finish,_Wall,_const_msg_finish_&> *)operator_new(0x30);
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  if (func != 0) {
    pcStack_30 = std::
                 _Function_handler<void_(Wall_*,_acto::actor_ref,_const_msg_finish_&),_void_(Wall::*)(acto::actor_ref,_const_msg_finish_&)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(Wall_*,_acto::actor_ref,_const_msg_finish_&),_void_(Wall::*)(acto::actor_ref,_const_msg_finish_&)>
               ::_M_manager;
    local_48._M_unused._M_member_pointer = func;
    local_48._8_8_ = in_RDX;
  }
  mem_handler_t<msg_finish,_Wall,_const_msg_finish_&>::mem_handler_t
            (local_58,(F *)&local_48,(Wall *)this);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  local_50._M_head_impl = &local_58->super_handler_t;
  local_58 = (mem_handler_t<msg_finish,_Wall,_const_msg_finish_&> *)0x0;
  set_handler(this,&local_28,
              (unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_> *)
              &local_50);
  if ((mem_handler_t<msg_finish,_Wall,_const_msg_finish_&> *)local_50._M_head_impl !=
      (mem_handler_t<msg_finish,_Wall,_const_msg_finish_&> *)0x0) {
    (*((handler_t *)&(local_50._M_head_impl)->_vptr_handler_t)->_vptr_handler_t[1])();
  }
  local_50._M_head_impl = (handler_t *)0x0;
  if (local_58 != (mem_handler_t<msg_finish,_Wall,_const_msg_finish_&> *)0x0) {
    std::default_delete<acto::actor::mem_handler_t<msg_finish,_Wall,_const_msg_finish_&>_>::
    operator()((default_delete<acto::actor::mem_handler_t<msg_finish,_Wall,_const_msg_finish_&>_> *)
               &local_58,local_58);
  }
  return;
}

Assistant:

void handler(void (ClassName::*func)(actor_ref, P)) {
    set_handler(
      // Type of the handler.
      std::type_index(typeid(M)),
      // Callback.
      std::make_unique<mem_handler_t<M, ClassName, P>>(
        func, static_cast<ClassName*>(this)));
  }